

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_fuseahuref(ASMState *as,IRRef ref,RegSet allow)

{
  Reg RVar1;
  IRIns *ir_00;
  long lVar2;
  int iVar3;
  int64_t ofs;
  GCupval *uv;
  GCfunc *fn;
  IRIns *ir;
  RegSet allow_local;
  IRRef ref_local;
  ASMState *as_local;
  
  ir_00 = as->ir + ref;
  if (((ir_00->field_1).r & 0x80) != 0) {
    switch((ir_00->field_1).o) {
    case '8':
      if (as->fuseref < ref) {
        asm_fusearef(as,ir_00,allow);
        return;
      }
      break;
    case '9':
      if (as->fuseref < ref) {
        RVar1 = ra_alloc1(as,(uint)(ir_00->field_0).op1,allow);
        (as->mrm).base = (uint8_t)RVar1;
        (as->mrm).ofs = (uint)*(ushort *)((long)as->ir + (ulong)(ir_00->field_0).op2 * 8 + 2) * 0x18
        ;
        (as->mrm).idx = 0x80;
        return;
      }
      break;
    default:
      break;
    case '=':
      if ((ir_00->field_0).op1 < 0x8000) {
        lVar2 = (*(long *)((long)as->ir[(ulong)(ir_00->field_0).op1 + 1] + 0x28 +
                          (long)((int)(uint)(ir_00->field_0).op2 >> 8) * 8) + 0x10) -
                (long)&as->J[1].L;
        iVar3 = (int)lVar2;
        if ((lVar2 == iVar3) && (lVar2 + 4 == (long)(iVar3 + 4))) {
          (as->mrm).ofs = iVar3;
          (as->mrm).base = '\x0e';
          (as->mrm).idx = 0x80;
          return;
        }
      }
      break;
    case '?':
      (as->mrm).ofs = ((int)as->J + -0x1f0) - ((int)as->J + 0xca8);
      (as->mrm).base = '\x0e';
      (as->mrm).idx = 0x80;
      return;
    }
  }
  RVar1 = ra_alloc1(as,ref,allow);
  (as->mrm).base = (uint8_t)RVar1;
  (as->mrm).ofs = 0;
  (as->mrm).idx = 0x80;
  return;
}

Assistant:

static void asm_fuseahuref(ASMState *as, IRRef ref, RegSet allow)
{
  IRIns *ir = IR(ref);
  if (ra_noreg(ir->r)) {
    switch ((IROp)ir->o) {
    case IR_AREF:
      if (mayfuse(as, ref)) {
	asm_fusearef(as, ir, allow);
	return;
      }
      break;
    case IR_HREFK:
      if (mayfuse(as, ref)) {
	as->mrm.base = (uint8_t)ra_alloc1(as, ir->op1, allow);
	as->mrm.ofs = (int32_t)(IR(ir->op2)->op2 * sizeof(Node));
	as->mrm.idx = RID_NONE;
	return;
      }
      break;
    case IR_UREFC:
      if (irref_isk(ir->op1)) {
	GCfunc *fn = ir_kfunc(IR(ir->op1));
	GCupval *uv = &gcref(fn->l.uvptr[(ir->op2 >> 8)])->uv;
#if LJ_GC64
	int64_t ofs = dispofs(as, &uv->tv);
	if (checki32(ofs) && checki32(ofs+4)) {
	  as->mrm.ofs = (int32_t)ofs;
	  as->mrm.base = RID_DISPATCH;
	  as->mrm.idx = RID_NONE;
	  return;
	}
#else
	as->mrm.ofs = ptr2addr(&uv->tv);
	as->mrm.base = as->mrm.idx = RID_NONE;
	return;
#endif
      }
      break;
    case IR_TMPREF:
#if LJ_GC64
      as->mrm.ofs = (int32_t)dispofs(as, &J2G(as->J)->tmptv);
      as->mrm.base = RID_DISPATCH;
      as->mrm.idx = RID_NONE;
#else
      as->mrm.ofs = igcptr(&J2G(as->J)->tmptv);
      as->mrm.base = as->mrm.idx = RID_NONE;
#endif
      return;
    default:
      break;
    }
  }
  as->mrm.base = (uint8_t)ra_alloc1(as, ref, allow);
  as->mrm.ofs = 0;
  as->mrm.idx = RID_NONE;
}